

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.h
# Opt level: O1

bool __thiscall
SigningProvider::GetKeyOriginByXOnly(SigningProvider *this,XOnlyPubKey *pubkey,KeyOriginInfo *info)

{
  int iVar1;
  CKeyID *id;
  pointer pCVar2;
  long in_FS_OFFSET;
  vector<CKeyID,_std::allocator<CKeyID>_> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  XOnlyPubKey::GetKeyIDs(&local_48,pubkey);
  for (pCVar2 = local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar2 != local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                super__Vector_impl_data._M_finish; pCVar2 = pCVar2 + 1) {
    iVar1 = (*this->_vptr_SigningProvider[7])(this,pCVar2,info);
    if ((char)iVar1 != '\0') break;
  }
  if (local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pCVar2 != local_48.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                     super__Vector_impl_data._M_finish;
  }
  __stack_chk_fail();
}

Assistant:

bool GetKeyOriginByXOnly(const XOnlyPubKey& pubkey, KeyOriginInfo& info) const
    {
        for (const auto& id : pubkey.GetKeyIDs()) {
            if (GetKeyOrigin(id, info)) return true;
        }
        return false;
    }